

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O0

void __thiscall asmjit::RAPass::RAPass(RAPass *this)

{
  CBPass *in_RDI;
  
  CBPass::CBPass(in_RDI,"RA");
  in_RDI->_vptr_CBPass = (_func_int **)&PTR__RAPass_00313ce0;
  memset(&in_RDI[1]._cb,0,0x60);
  *(undefined4 *)&in_RDI[6]._vptr_CBPass = 0;
  in_RDI[6]._cb = (CodeBuilder *)0x0;
  in_RDI[6]._name = (char *)0x0;
  in_RDI[7]._vptr_CBPass = (_func_int **)0x0;
  in_RDI[7]._cb = (CodeBuilder *)0x0;
  in_RDI[7]._name = (char *)0x0;
  in_RDI[8]._vptr_CBPass = (_func_int **)0x0;
  in_RDI[8]._cb = (CodeBuilder *)0x0;
  in_RDI[8]._name = (char *)0x0;
  in_RDI[9]._vptr_CBPass = (_func_int **)0x0;
  return;
}

Assistant:

RAPass::RAPass() noexcept :
  CBPass("RA"),
  _varMapToVaListOffset(0) {}